

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O3

lzma_ret lz_encoder_update(lzma_coder_conflict14 *coder,lzma_allocator *allocator,
                          lzma_filter *filters_null,lzma_filter *reversed_filters)

{
  _func_lzma_ret_lzma_coder_ptr_lzma_filter_ptr_conflict1 *p_Var1;
  lzma_ret lVar2;
  
  p_Var1 = (coder->lz).options_update;
  if (p_Var1 == (_func_lzma_ret_lzma_coder_ptr_lzma_filter_ptr_conflict1 *)0x0) {
    lVar2 = LZMA_PROG_ERROR;
  }
  else {
    lVar2 = (*p_Var1)((coder->lz).coder,reversed_filters);
    if (lVar2 == LZMA_OK) {
      lVar2 = lzma_next_filter_update
                        ((lzma_next_coder *)&coder->next,allocator,reversed_filters + 1);
      return lVar2;
    }
  }
  return lVar2;
}

Assistant:

static lzma_ret
lz_encoder_update(lzma_coder *coder, lzma_allocator *allocator,
		const lzma_filter *filters_null lzma_attribute((__unused__)),
		const lzma_filter *reversed_filters)
{
	if (coder->lz.options_update == NULL)
		return LZMA_PROG_ERROR;

	return_if_error(coder->lz.options_update(
			coder->lz.coder, reversed_filters));

	return lzma_next_filter_update(
			&coder->next, allocator, reversed_filters + 1);
}